

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void __thiscall Test_Template_Section::Test_Template_Section(Test_Template_Section *this)

{
  value_type local_18;
  Test_Template_Section *local_10;
  Test_Template_Section *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(Template, Section) {
  Template* tpl = StringToTemplate(
      "boo!\nhi {{#SEC}}lo{{#SUBSEC}}jo{{/SUBSEC}}{{/SEC}} bar",
      STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  AssertExpandIs(tpl, &dict, "boo!hi  bar", true);
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "boo!hi lo bar", true);
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "boo!hi lo bar", true);
  // This should work even though subsec isn't a child of the main dict
  dict.ShowSection("SUBSEC");
  AssertExpandIs(tpl, &dict, "boo!hi lojo bar", true);

  TemplateDictionary dict2("dict2");
  dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lo bar", true);
  dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lolo bar", true);
  dict2.AddSectionDictionary("sec");
  AssertExpandIs(tpl, &dict2, "boo!hi lolo bar", true);
  dict2.ShowSection("SUBSEC");
  AssertExpandIs(tpl, &dict2, "boo!hi lojolojo bar", true);
}